

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManUpdateStats(Nf_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Jf_Par_t *pJVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  Nf_Obj_t *pNVar8;
  int *piVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint *puVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long local_50;
  
  pJVar4 = p->pPars;
  pJVar4->MapAreaF = 0.0;
  p->nInvs = 0;
  pJVar4->Area = 0;
  pJVar4->Edge = 0;
  pGVar5 = p->pGia;
  iVar1 = pGVar5->nObjs;
  local_50 = (long)iVar1;
  if (1 < local_50) {
    pGVar6 = pGVar5->pObjs;
    lVar15 = local_50 << 6;
    uVar17 = local_50 * 2;
    do {
      uVar17 = uVar17 - 2;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      lVar16 = local_50 + -1;
      uVar7 = *(undefined8 *)(pGVar6 + lVar16);
      uVar12 = (uint)uVar7;
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        if ((((int)uVar12 < 0) || ((uVar12 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar12 & 0x1fffffff) != ((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff))) {
          uVar20 = uVar17 & 0xffffffff;
          iVar2 = (p->vMapRefs).nSize;
          lVar21 = 0;
          do {
            if (iVar2 <= (int)uVar20) goto LAB_00781b41;
            if ((p->vMapRefs).pArray[uVar20] != 0) {
              pNVar8 = p->pNfObjs;
              uVar12 = *(uint *)(&pNVar8[-1].M[0][0].field_0x0 + lVar15 + lVar21);
              uVar3 = *(uint *)((long)(pNVar8->M + -2) + lVar21 + 0x10 + lVar15);
              if (-1 < (int)(uVar3 ^ uVar12)) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              if ((int)uVar12 < 0) {
                puVar18 = (uint *)(&pNVar8[-1].M[0][0].field_0x0 + lVar21 + lVar15);
              }
              else {
                puVar18 = (uint *)0x0;
              }
              puVar13 = (uint *)((long)(pNVar8->M + -2) + 0x10 + lVar21 + lVar15);
              if (-1 < (int)uVar3) {
                puVar13 = puVar18;
              }
              uVar12 = *puVar13;
              if ((uVar12 >> 0x1e & 1) == 0) {
                if ((p->vCutSets).nSize < local_50) goto LAB_00781b41;
                uVar3 = (p->vCutSets).pArray[lVar16];
                uVar11 = (int)uVar3 >> 0x10;
                if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar19 = uVar12 >> 0x14 & 0x3ff;
                if (uVar19 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x94,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar14 = (ulong)((uVar12 & 0xfffff) * 0x50);
                uVar12 = *(uint *)((long)(p->vPages).pArray[uVar11] +
                                  (ulong)uVar19 * 4 + (ulong)(uVar3 & 0xffff) * 4) & 0x1f;
                if (uVar12 != *(uint *)((long)p->pCells->iDelays + (uVar14 - 0x1c)) >> 0x1c) {
                  __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x865,"void Nf_ManUpdateStats(Nf_Man_t *)");
                }
                pJVar4->MapAreaF =
                     *(float *)((long)p->pCells->iDelays + (uVar14 - 0x18)) + pJVar4->MapAreaF;
                pJVar4->Edge = pJVar4->Edge + (ulong)uVar12;
                pJVar4->Area = pJVar4->Area + 1;
              }
              else {
                pJVar4->MapAreaF = p->InvAreaF + pJVar4->MapAreaF;
                pJVar4->Edge = pJVar4->Edge + 1;
                pJVar4->Area = pJVar4->Area + 1;
                p->nInvs = p->nInvs + 1;
              }
            }
            lVar21 = lVar21 + 0x20;
            uVar20 = uVar20 + 1;
          } while (lVar21 == 0x20);
        }
        else {
          lVar21 = lVar16 * 2 + 1;
          if ((p->vMapRefs).nSize <= lVar21) goto LAB_00781b41;
          if ((p->vMapRefs).pArray[lVar21] != 0) {
            pJVar4->MapAreaF = p->InvAreaF + pJVar4->MapAreaF;
            pJVar4->Edge = pJVar4->Edge + 1;
            pJVar4->Area = pJVar4->Area + 1;
            p->nInvs = p->nInvs + 1;
          }
        }
      }
      lVar15 = lVar15 + -0x40;
      bVar10 = 2 < local_50;
      local_50 = lVar16;
    } while (bVar10);
  }
  lVar15 = (long)pGVar5->vCis->nSize;
  if (0 < lVar15) {
    piVar9 = pGVar5->vCis->pArray;
    lVar16 = 0;
    do {
      uVar12 = piVar9[lVar16];
      if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((ulong)uVar12 == 0) {
        return;
      }
      lVar21 = (ulong)uVar12 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar21) {
LAB_00781b41:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vMapRefs).pArray[lVar21] != 0) {
        pJVar4->MapAreaF = p->InvAreaF + pJVar4->MapAreaF;
        pJVar4->Edge = pJVar4->Edge + 1;
        pJVar4->Area = pJVar4->Area + 1;
        p->nInvs = p->nInvs + 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  return;
}

Assistant:

void Nf_ManUpdateStats( Nf_Man_t * p )
{
    Nf_Mat_t * pM;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    int i, c, Id, * pCut;
    p->pPars->MapAreaF = 0; p->nInvs = 0;
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
            }
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            if ( pM->fCompl )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
                continue;
            }
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            pCell = Nf_ManCell( p, pM->Gate );
            assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
            p->pPars->MapAreaF += pCell->AreaF;
            p->pPars->Edge += Nf_CutSize(pCut);
            p->pPars->Area++;
            //printf( "%5d (%d) : Gate = %7s \n", i, c, pCell->pName );
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            p->pPars->MapAreaF += p->InvAreaF;
            p->pPars->Edge++;
            p->pPars->Area++;
            p->nInvs++;
        }
}